

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O1

Abc_ZddMan * Abc_ZddManAlloc(int nVars,int nObjs)

{
  uint uVar1;
  uint uVar2;
  Abc_ZddMan *p;
  int *piVar3;
  Abc_ZddEnt *pAVar4;
  Abc_ZddObj *pAVar5;
  int iVar6;
  
  p = (Abc_ZddMan *)calloc(1,0x60);
  p->nVars = nVars;
  p->nObjsAlloc = nObjs;
  iVar6 = nObjs;
  if (1 < (uint)nObjs) {
    uVar1 = nObjs - 1;
    if (uVar1 == 0) {
      iVar6 = 0;
    }
    else {
      iVar6 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      iVar6 = iVar6 + 0x21;
    }
  }
  uVar1 = -1 << ((byte)iVar6 & 0x1f);
  p->nUniqueMask = ~uVar1;
  iVar6 = nObjs;
  if (1 < (uint)nObjs) {
    uVar2 = nObjs - 1;
    if (uVar2 == 0) {
      iVar6 = 0;
    }
    else {
      iVar6 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      iVar6 = iVar6 + 0x21;
    }
  }
  uVar2 = -1 << ((byte)iVar6 & 0x1f);
  p->nCacheMask = ~uVar2;
  piVar3 = (int *)calloc((ulong)-uVar1,4);
  p->pUnique = piVar3;
  piVar3 = (int *)calloc((long)nObjs,4);
  p->pNexts = piVar3;
  pAVar4 = (Abc_ZddEnt *)calloc((ulong)-uVar2,0x10);
  p->pCache = pAVar4;
  pAVar5 = (Abc_ZddObj *)calloc((long)nObjs,0xc);
  p->pObjs = pAVar5;
  p->nObjs = 2;
  *(undefined4 *)pAVar5 = 0xffffffff;
  pAVar5->True = 0xffffffff;
  pAVar5->False = 0xffffffff;
  *(undefined4 *)(pAVar5 + 1) = 0xffffffff;
  pAVar5[1].True = 0xffffffff;
  pAVar5[1].False = 0xffffffff;
  *(uint *)pAVar5 = nVars | 0x80000000;
  *(uint *)(pAVar5 + 1) = *(uint *)(pAVar5 + 1) & 0x80000000 | nVars & 0x7fffffffU;
  if (0 < nVars) {
    iVar6 = 0;
    do {
      Abc_ZddUniqueCreate(p,iVar6,1,0);
      iVar6 = iVar6 + 1;
    } while (nVars != iVar6);
  }
  if (p->nObjs == nVars + 2) {
    p->nMemory = ((ulong)((long)p->nObjsAlloc * 0xc) >> 2) +
                 (ulong)p->nUniqueMask + (long)p->nObjsAlloc + (ulong)(p->nCacheMask + 1) * 4 + 0x19
    ;
    return p;
  }
  __assert_fail("p->nObjs == nVars + 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPerm.c"
                ,0xca,"Abc_ZddMan *Abc_ZddManAlloc(int, int)");
}

Assistant:

Abc_ZddMan * Abc_ZddManAlloc( int nVars, int nObjs )
{
    Abc_ZddMan * p; int i;
    p = ABC_CALLOC( Abc_ZddMan, 1 );
    p->nVars       = nVars;
    p->nObjsAlloc  = nObjs;
    p->nUniqueMask = (1 << Abc_Base2Log(nObjs)) - 1;
    p->nCacheMask  = (1 << Abc_Base2Log(nObjs)) - 1;
    p->pUnique     = ABC_CALLOC( int, p->nUniqueMask + 1 );
    p->pNexts      = ABC_CALLOC( int, p->nObjsAlloc );
    p->pCache      = ABC_CALLOC( Abc_ZddEnt, p->nCacheMask + 1 );
    p->pObjs       = ABC_CALLOC( Abc_ZddObj, p->nObjsAlloc );
    p->nObjs       = 2;
    memset( p->pObjs, 0xff, sizeof(Abc_ZddObj) * 2 );
    p->pObjs[0].Var = nVars;
    p->pObjs[1].Var = nVars;
    for ( i = 0; i < nVars; i++ )
        Abc_ZddUniqueCreate( p, i, 1, 0 );
    assert( p->nObjs == nVars + 2 );
    p->nMemory = sizeof(Abc_ZddMan)/4 + 
        p->nUniqueMask + 1 + p->nObjsAlloc + 
        (p->nCacheMask + 1) * sizeof(Abc_ZddEnt)/4 + 
        p->nObjsAlloc * sizeof(Abc_ZddObj)/4;
    return p;
}